

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-s-parser.cpp
# Opt level: O0

void __thiscall
wasm::SExpressionWasmBuilder::parseElem(SExpressionWasmBuilder *this,Element *s,Table *table)

{
  int iVar1;
  IString str;
  uint uVar2;
  bool bVar3;
  Const *pCVar4;
  pointer pEVar5;
  Element *pEVar6;
  Element *pEVar7;
  Expression *pEVar8;
  ulong uVar9;
  size_t sVar10;
  ParseException *pPVar11;
  reference this_00;
  pointer pTVar12;
  IString str_00;
  IString IVar13;
  Name NVar14;
  bool local_301;
  bool local_2aa;
  bool local_1d2;
  allocator<char> local_189;
  string local_188;
  uintptr_t local_168;
  string_view local_160;
  undefined1 local_14a;
  allocator<char> local_149;
  string local_148;
  Element *local_128;
  size_t sStack_120;
  Element *local_118;
  Element *inner;
  char *local_108;
  Element *local_100;
  Element *inner_1;
  char *pcStack_f0;
  size_t local_e8;
  char *pcStack_e0;
  size_t local_d8;
  size_t sStack_d0;
  unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> local_c0;
  __single_object segment;
  Name local_98;
  size_t local_88;
  size_t sStack_80;
  __single_object segment_1;
  Literal local_60;
  Const *local_48;
  Expression *offset;
  undefined1 auStack_38 [5];
  bool usesExpressions;
  bool isPassive;
  bool hasExplicitName;
  Name name;
  Index i;
  Table *table_local;
  Element *s_local;
  SExpressionWasmBuilder *this_local;
  
  name.super_IString.str._M_str._4_4_ = 1;
  iVar1 = this->elemCounter;
  this->elemCounter = iVar1 + 1;
  _auStack_38 = (string_view)wasm::Name::fromInt((long)iVar1);
  offset._7_1_ = 0;
  offset._6_1_ = 1;
  offset._5_1_ = 0;
  if (table != (Table *)0x0) {
    pCVar4 = MixedArena::alloc<wasm::Const>(this->allocator);
    wasm::Literal::Literal(&local_60,0);
    pCVar4 = Const::set(pCVar4,&local_60);
    wasm::Literal::~Literal(&local_60);
    local_48 = pCVar4;
    std::make_unique<wasm::ElementSegment,wasm::Name&,wasm::Expression*&>
              ((Name *)&stack0xffffffffffffff88,(Expression **)table);
    pEVar5 = std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>::
             operator->((unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                         *)&stack0xffffffffffffff88);
    local_88 = _auStack_38;
    sStack_80 = name.super_IString.str._M_len;
    Named::setName(&pEVar5->super_Named,(Name)_auStack_38,(bool)(offset._7_1_ & 1));
    std::vector<wasm::Name,_std::allocator<wasm::Name>_>::push_back
              (&this->elemSegmentNames,(value_type *)auStack_38);
    uVar2 = name.super_IString.str._M_str._4_4_;
    pEVar6 = Element::operator[](s,name.super_IString.str._M_str._4_4_);
    bVar3 = Element::isList(pEVar6);
    parseElemFinish(this,s,(unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                            *)&stack0xffffffffffffff88,uVar2,bVar3);
    std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>::~unique_ptr
              ((unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *)
               &stack0xffffffffffffff88);
    return;
  }
  pEVar6 = Element::operator[](s,name.super_IString.str._M_str._4_4_);
  bVar3 = Element::isStr(pEVar6);
  if (bVar3) {
    pEVar6 = Element::operator[](s,name.super_IString.str._M_str._4_4_);
    bVar3 = Element::dollared(pEVar6);
    uVar2 = name.super_IString.str._M_str._4_4_;
    if (bVar3) {
      name.super_IString.str._M_str._4_4_ = name.super_IString.str._M_str._4_4_ + 1;
      pEVar6 = Element::operator[](s,uVar2);
      IVar13 = Element::str(pEVar6);
      wasm::Name::Name(&local_98,IVar13);
      wasm::Name::operator=((Name *)auStack_38,&local_98);
      offset._7_1_ = 1;
    }
  }
  std::vector<wasm::Name,_std::allocator<wasm::Name>_>::push_back
            (&this->elemSegmentNames,(value_type *)auStack_38);
  pEVar6 = Element::operator[](s,name.super_IString.str._M_str._4_4_);
  bVar3 = Element::isStr(pEVar6);
  local_1d2 = false;
  if (bVar3) {
    pEVar6 = Element::operator[](s,name.super_IString.str._M_str._4_4_);
    _segment = (string_view)Element::str(pEVar6);
    local_1d2 = IString::operator==((IString *)&segment,(IString *)DECLARE);
  }
  if (local_1d2 != false) {
    return;
  }
  std::make_unique<wasm::ElementSegment>();
  pEVar5 = std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>::
           operator->(&local_c0);
  local_d8 = _auStack_38;
  sStack_d0 = name.super_IString.str._M_len;
  pEVar7 = (Element *)(ulong)(offset._7_1_ & 1);
  Named::setName(&pEVar5->super_Named,(Name)_auStack_38,SUB41(offset._7_1_ & 1,0));
  pEVar6 = Element::operator[](s,name.super_IString.str._M_str._4_4_);
  bVar3 = Element::isList(pEVar6);
  if (bVar3) {
    pEVar6 = Element::operator[](s,name.super_IString.str._M_str._4_4_);
    local_e8 = REF;
    pcStack_e0 = DAT_027e5850;
    IVar13.str._M_str = DAT_027e5850;
    IVar13.str._M_len = REF;
    bVar3 = elementStartsWith(pEVar6,IVar13);
    if (!bVar3) {
      pEVar6 = Element::operator[](s,name.super_IString.str._M_str._4_4_);
      inner_1 = TABLE;
      pcStack_f0 = DAT_027e57e0;
      str.str._M_str = DAT_027e57e0;
      str.str._M_len = (size_t)TABLE;
      bVar3 = elementStartsWith(pEVar6,str);
      uVar2 = name.super_IString.str._M_str._4_4_;
      if (bVar3) {
        name.super_IString.str._M_str._4_4_ = name.super_IString.str._M_str._4_4_ + 1;
        local_100 = Element::operator[](s,uVar2);
        pEVar6 = Element::operator[](local_100,1);
        NVar14 = getTableName(this,pEVar6);
        local_108 = NVar14.super_IString.str._M_str;
        pEVar7 = NVar14.super_IString.str._M_len;
        inner = pEVar7;
        pEVar5 = std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>::
                 operator->(&local_c0);
        wasm::Name::operator=(&pEVar5->table,(Name *)&inner);
      }
      uVar2 = name.super_IString.str._M_str._4_4_;
      name.super_IString.str._M_str._4_4_ = name.super_IString.str._M_str._4_4_ + 1;
      local_118 = Element::operator[](s,uVar2);
      local_128 = OFFSET;
      sStack_120 = DAT_027e5a90;
      str_00.str._M_str = &pEVar7->isList_;
      str_00.str._M_len = DAT_027e5a90;
      bVar3 = elementStartsWith((wasm *)local_118,OFFSET,str_00);
      if (bVar3) {
        sVar10 = Element::size(local_118);
        if (2 < sVar10) {
          local_14a = 1;
          pPVar11 = (ParseException *)__cxa_allocate_exception(0x30);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_148,"Invalid offset for an element segment.",&local_149);
          ParseException::ParseException(pPVar11,&local_148,s->line,s->col);
          local_14a = 0;
          __cxa_throw(pPVar11,&ParseException::typeinfo,ParseException::~ParseException);
        }
        pEVar6 = Element::operator[](local_118,1);
        pEVar8 = parseExpression(this,pEVar6);
        pEVar5 = std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>::
                 operator->(&local_c0);
        pEVar5->offset = pEVar8;
      }
      else {
        pEVar8 = parseExpression(this,local_118);
        pEVar5 = std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>::
                 operator->(&local_c0);
        pEVar5->offset = pEVar8;
      }
      offset._6_1_ = 0;
    }
  }
  uVar9 = (ulong)name.super_IString.str._M_str._4_4_;
  sVar10 = Element::size(s);
  if (uVar9 < sVar10) {
    pEVar6 = Element::operator[](s,name.super_IString.str._M_str._4_4_);
    bVar3 = Element::isStr(pEVar6);
    if (bVar3) {
      pEVar6 = Element::operator[](s,name.super_IString.str._M_str._4_4_);
      bVar3 = Element::dollared(pEVar6);
      if (bVar3) {
        offset._5_1_ = 0;
        goto LAB_01c51675;
      }
    }
    pEVar6 = Element::operator[](s,name.super_IString.str._M_str._4_4_);
    bVar3 = Element::isStr(pEVar6);
    local_2aa = false;
    if (bVar3) {
      pEVar6 = Element::operator[](s,name.super_IString.str._M_str._4_4_);
      local_160 = (string_view)Element::str(pEVar6);
      local_2aa = IString::operator==((IString *)&local_160,(IString *)&FUNC);
    }
    if (local_2aa == false) {
      pEVar6 = Element::operator[](s,name.super_IString.str._M_str._4_4_);
      local_168 = (uintptr_t)elementToType(this,pEVar6);
      pEVar5 = std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>::
               operator->(&local_c0);
      (pEVar5->type).id = local_168;
    }
    name.super_IString.str._M_str._4_4_ = name.super_IString.str._M_str._4_4_ + 1;
    offset._5_1_ = local_2aa == false;
  }
LAB_01c51675:
  if ((offset._6_1_ & 1) == 0) {
    pEVar5 = std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>::
             operator->(&local_c0);
    bVar3 = IString::isNull(&(pEVar5->table).super_IString);
    if (bVar3) {
      bVar3 = std::
              vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
              ::empty(&this->wasm->tables);
      if (bVar3) {
        pPVar11 = (ParseException *)__cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_188,"active element without table",&local_189);
        ParseException::ParseException(pPVar11,&local_188,s->line,s->col);
        __cxa_throw(pPVar11,&ParseException::typeinfo,ParseException::~ParseException);
      }
      this_00 = std::
                vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                ::front(&this->wasm->tables);
      pTVar12 = std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::get(this_00);
      pEVar5 = std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>::
               operator->(&local_c0);
      wasm::Name::operator=(&pEVar5->table,(Name *)pTVar12);
    }
  }
  local_301 = true;
  if ((offset._5_1_ & 1) == 0) {
    pEVar5 = std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>::get
                       (&local_c0);
    local_301 = TableUtils::usesExpressions(pEVar5,this->wasm);
  }
  offset._5_1_ = local_301;
  parseElemFinish(this,s,&local_c0,name.super_IString.str._M_str._4_4_,local_301);
  std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>::~unique_ptr
            (&local_c0);
  return;
}

Assistant:

void SExpressionWasmBuilder::parseElem(Element& s, Table* table) {
  Index i = 1;
  Name name = Name::fromInt(elemCounter++);
  bool hasExplicitName = false;
  bool isPassive = true;
  bool usesExpressions = false;

  if (table) {
    Expression* offset = allocator.alloc<Const>()->set(Literal(int32_t(0)));
    auto segment = std::make_unique<ElementSegment>(table->name, offset);
    segment->setName(name, hasExplicitName);
    elemSegmentNames.push_back(name);
    parseElemFinish(s, segment, i, s[i]->isList());
    return;
  }

  if (s[i]->isStr() && s[i]->dollared()) {
    name = s[i++]->str();
    hasExplicitName = true;
  }
  elemSegmentNames.push_back(name);
  if (s[i]->isStr() && s[i]->str() == DECLARE) {
    // We don't store declared segments in the IR
    return;
  }

  auto segment = std::make_unique<ElementSegment>();
  segment->setName(name, hasExplicitName);

  if (s[i]->isList() && !elementStartsWith(s[i], REF)) {
    // Optional (table <tableidx>)
    if (elementStartsWith(s[i], TABLE)) {
      auto& inner = *s[i++];
      segment->table = getTableName(*inner[1]);
    }

    // Offset expression (offset (<expr>)) | (<expr>)
    auto& inner = *s[i++];
    if (elementStartsWith(inner, OFFSET)) {
      if (inner.size() > 2) {
        throw ParseException(
          "Invalid offset for an element segment.", s.line, s.col);
      }
      segment->offset = parseExpression(inner[1]);
    } else {
      segment->offset = parseExpression(inner);
    }
    isPassive = false;
  }

  if (i < s.size()) {
    if (s[i]->isStr() && s[i]->dollared()) {
      usesExpressions = false;
    } else if (s[i]->isStr() && s[i]->str() == FUNC) {
      usesExpressions = false;
      i += 1;
    } else {
      segment->type = elementToType(*s[i]);
      usesExpressions = true;
      i += 1;
    }
  }

  if (!isPassive && segment->table.isNull()) {
    if (wasm.tables.empty()) {
      throw ParseException("active element without table", s.line, s.col);
    }
    table = wasm.tables.front().get();
    segment->table = table->name;
  }

  // We may be post-MVP also due to type reasons or otherwise, as detected by
  // the utility function for Binaryen IR.
  usesExpressions =
    usesExpressions || TableUtils::usesExpressions(segment.get(), &wasm);

  parseElemFinish(s, segment, i, usesExpressions);
}